

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

field_type_t cfgfile::generator::cfg::field_type_from_string(string *type)

{
  __type _Var1;
  field_type_t fVar2;
  
  _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               c_scalar_tag_name_abi_cxx11_);
  if (_Var1) {
    fVar2 = scalar_field_type;
  }
  else {
    _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)c_no_value_tag_name_abi_cxx11_);
    if (_Var1) {
      fVar2 = no_value_field_type;
    }
    else {
      _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)c_scalar_vector_tag_name_abi_cxx11_);
      if (_Var1) {
        fVar2 = scalar_vector_field_type;
      }
      else {
        _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)c_vector_of_tags_tag_name_abi_cxx11_);
        if (_Var1) {
          fVar2 = vector_of_tags_field_type;
        }
        else {
          _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)c_custom_tag_name_abi_cxx11_);
          fVar2 = (uint)_Var1 + (uint)_Var1 * 4;
        }
      }
    }
  }
  return fVar2;
}

Assistant:

static inline field_t::field_type_t field_type_from_string( const std::string & type )
{
	if( type == c_scalar_tag_name )
		return field_t::scalar_field_type;
	else if( type == c_no_value_tag_name )
		return field_t::no_value_field_type;
	else if( type == c_scalar_vector_tag_name )
		return field_t::scalar_vector_field_type;
	else if( type == c_vector_of_tags_tag_name )
		return field_t::vector_of_tags_field_type;
	else if( type == c_custom_tag_name )
		return field_t::custom_tag_field_type;
	else
		return field_t::unknown_field_type;
}